

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O0

size_t __thiscall higan::TimeStamp::FormatToBuffer(TimeStamp *this,char *buffer,size_t len)

{
  int iVar1;
  tm *__tp;
  int s_len;
  tm *now_tm;
  time_t now_second;
  size_t len_local;
  char *buffer_local;
  TimeStamp *this_local;
  
  now_tm = (tm *)(this->microsecond_time_ / 1000000);
  now_second = len;
  len_local = (size_t)buffer;
  buffer_local = (char *)this;
  if ((tm *)g_last_second != now_tm) {
    __tp = localtime((time_t *)&now_tm);
    g_time_buffer_len = strftime(g_time_buffer,0x20,"%Y-%m-%d %H:%M:%S",__tp);
  }
  strcpy((char *)len_local,g_time_buffer);
  iVar1 = snprintf((char *)(len_local + g_time_buffer_len),now_second - g_time_buffer_len,".%06ld",
                   this->microsecond_time_ % 1000000);
  return g_time_buffer_len + (long)iVar1;
}

Assistant:

size_t TimeStamp::FormatToBuffer(char* buffer, size_t len) const
{
	time_t now_second = microsecond_time_ / MICROSECOND_PER_SECOND;
	if (g_last_second != now_second)
	{
		struct tm* now_tm = localtime(&now_second);
		g_time_buffer_len = strftime(g_time_buffer, sizeof g_time_buffer, "%Y-%m-%d %H:%M:%S", now_tm);
	}

	strcpy(buffer, g_time_buffer);
	int s_len = snprintf(buffer + g_time_buffer_len, len - g_time_buffer_len,
			".%06ld", microsecond_time_ % MICROSECOND_PER_SECOND);

	return g_time_buffer_len + s_len;
}